

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QPoint>::insert
          (QPodArrayOps<QPoint> *this,qsizetype i,qsizetype n,parameter_type t)

{
  QPoint QVar1;
  QPoint *pQVar2;
  long lVar3;
  GrowthPosition where;
  
  QVar1 = *t;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QPoint>).size != 0);
  QArrayDataPointer<QPoint>::detachAndGrow
            (&this->super_QArrayDataPointer<QPoint>,where,n,(QPoint **)0x0,
             (QArrayDataPointer<QPoint> *)0x0);
  pQVar2 = createHole(this,where,i,n);
  if (n != 0) {
    lVar3 = 0;
    do {
      pQVar2[lVar3] = QVar1;
      lVar3 = lVar3 + 1;
    } while (n != lVar3);
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }